

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O2

bool __thiscall
Diligent::DearchiverBase::LoadArchive
          (DearchiverBase *this,IDataBlob *pArchiveData,Uint32 ContentVersion,bool MakeCopy)

{
  ResourceType _Type;
  unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
  this_00;
  unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
  *puVar1;
  bool bVar2;
  bool bVar3;
  pointer pAVar4;
  const_iterator cVar5;
  long *plVar6;
  char (*in_R8) [33];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false,_false>,_bool>
  pVar7;
  unique_ptr<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
  pObjArchive;
  char *ResName;
  string _msg;
  size_t ArchiveIdx;
  
  if (pArchiveData == (IDataBlob *)0x0) {
    bVar2 = false;
  }
  else {
    pAVar4 = (this->m_Archives).
             super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pAVar4 == (this->m_Archives).
                    super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        std::make_unique<Diligent::DeviceObjectArchive>();
        _msg._M_dataplus._M_p = (pointer)pArchiveData;
        _msg._M_string_length._0_4_ = ContentVersion;
        _msg._M_string_length._4_1_ = MakeCopy;
        bVar2 = DeviceObjectArchive::Deserialize
                          ((DeviceObjectArchive *)
                           pObjArchive._M_t.
                           super___uniq_ptr_impl<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Diligent::DeviceObjectArchive_*,_std::default_delete<Diligent::DeviceObjectArchive>_>
                           .super__Head_base<0UL,_Diligent::DeviceObjectArchive_*,_false>.
                           _M_head_impl,(CreateInfo *)&_msg);
        if (bVar2) {
          ArchiveIdx = ((long)(this->m_Archives).
                              super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_Archives).
                             super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x1c8;
          plVar6 = (long *)((long)pObjArchive._M_t.
                                  super___uniq_ptr_impl<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Diligent::DeviceObjectArchive_*,_std::default_delete<Diligent::DeviceObjectArchive>_>
                                  .super__Head_base<0UL,_Diligent::DeviceObjectArchive_*,_false>.
                                  _M_head_impl + 0x10);
          while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
            _Type = *(ResourceType *)(plVar6 + 1);
            ResName = (char *)plVar6[2];
            DeviceObjectArchive::NamedResourceKey::NamedResourceKey
                      ((NamedResourceKey *)&_msg,_Type,ResName,true);
            pVar7 = std::
                    _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    ::
                    _M_emplace<Diligent::DeviceObjectArchive::NamedResourceKey,unsigned_long_const&>
                              ((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                *)&this->m_ResNameToArchiveIdx,&_msg,&ArchiveIdx);
            HashMapStringKey::Clear((HashMapStringKey *)&_msg._M_string_length);
            if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              this_00._M_t.
              super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
              .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl =
                   (this->m_Archives).
                   super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(long *)((long)pVar7.first.
                                    super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false>
                                    ._M_cur.
                                    super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false>
                             + 0x20)].pObjArchive._M_t;
              DeviceObjectArchive::NamedResourceKey::NamedResourceKey
                        ((NamedResourceKey *)&_msg,_Type,ResName,false);
              cVar5 = std::
                      _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              *)this_00._M_t.
                                super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                                .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>
                                ._M_head_impl,(key_type *)&_msg);
              HashMapStringKey::Clear((HashMapStringKey *)&_msg._M_string_length);
              if ((cVar5.
                   super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                   ._M_cur == (__node_type *)0x0) ||
                 (bVar3 = DeviceObjectArchive::ResourceData::operator==
                                    ((ResourceData *)(plVar6 + 4),
                                     (ResourceData *)
                                     ((long)cVar5.
                                            super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                            ._M_cur + 0x20)), !bVar3)) {
                FormatString<char[21],char_const*,char[33]>
                          (&_msg,(Diligent *)"Resource with name \'",(char (*) [21])&ResName,
                           (char **)"\' already exists in the archive.",in_R8);
                if (DebugMessageCallback != (undefined *)0x0) {
                  in_R8 = (char (*) [33])0x0;
                  (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0);
                }
                std::__cxx11::string::~string((string *)&_msg);
              }
            }
          }
          std::
          vector<Diligent::DearchiverBase::ArchiveData,std::allocator<Diligent::DearchiverBase::ArchiveData>>
          ::
          emplace_back<std::unique_ptr<Diligent::DeviceObjectArchive,std::default_delete<Diligent::DeviceObjectArchive>>>
                    ((vector<Diligent::DearchiverBase::ArchiveData,std::allocator<Diligent::DearchiverBase::ArchiveData>>
                      *)&this->m_Archives,&pObjArchive);
        }
        std::
        unique_ptr<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
        ::~unique_ptr(&pObjArchive);
        return bVar2;
      }
      puVar1 = &pAVar4->pObjArchive;
      pAVar4 = pAVar4 + 1;
    } while ((((puVar1->_M_t).
               super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
               .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl)->
             m_pArchiveData).m_pObject != pArchiveData);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool DearchiverBase::LoadArchive(const IDataBlob* pArchiveData, Uint32 ContentVersion, bool MakeCopy)
{
    if (pArchiveData == nullptr)
        return false;

    for (const ArchiveData& Archive : m_Archives)
    {
        if (Archive.pObjArchive->GetData() == pArchiveData)
        {
            // The archive is already loaded
            return true;
        }
    }

    std::unique_ptr<DeviceObjectArchive> pObjArchive = std::make_unique<DeviceObjectArchive>();
    if (!pObjArchive->Deserialize(DeviceObjectArchive::CreateInfo{pArchiveData, ContentVersion, MakeCopy}))
        return false;

    const size_t ArchiveIdx = m_Archives.size();

    const auto& ArchiveResources = pObjArchive->GetNamedResources();
    for (const auto& it : ArchiveResources)
    {
        const ResourceType ResType      = it.first.GetType();
        const char*        ResName      = it.first.GetName();
        constexpr bool     MakeNameCopy = true;

        const auto it_inserted = m_ResNameToArchiveIdx.emplace(NamedResourceKey{ResType, ResName, MakeNameCopy}, ArchiveIdx);
        if (!it_inserted.second)
        {
            const auto& OtherArchiveResources = m_Archives[it_inserted.first->second].pObjArchive->GetNamedResources();
            const auto  it_other              = OtherArchiveResources.find(NamedResourceKey{ResType, ResName});

            const bool IsDuplicate =
                (it_other != OtherArchiveResources.end()) &&
                (it.second == it_other->second);
            if (!IsDuplicate)
            {
                LOG_ERROR_MESSAGE("Resource with name '", ResName, "' already exists in the archive.");
            }
        }
    }

    m_Archives.emplace_back(std::move(pObjArchive));

    return true;
}